

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall NaStateSpaceModel::Load(NaStateSpaceModel *this,NaDataStream *ds)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  NaReal *pNVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  NaDataStream *in_RSI;
  long in_RDI;
  double dVar6;
  uint j;
  uint i;
  char *p;
  char *s;
  char *szBuf;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  double in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  double in_stack_ffffffffffffff98;
  uint n;
  uint in_stack_ffffffffffffffa0;
  uint local_30;
  uint local_2c;
  char *local_28;
  char *local_20;
  char *local_18;
  NaDataStream *local_10;
  
  local_10 = in_RSI;
  NaDataStream::GetF(in_RSI,"%u %u %u",in_RDI + 0x40,in_RDI + 0x44,in_RDI + 0x48);
  NaPrintLog("N=%d  M=%d  K=%d\n",(ulong)*(uint *)(in_RDI + 0x40),(ulong)*(uint *)(in_RDI + 0x44),
             (ulong)*(uint *)(in_RDI + 0x48));
  NaMatrix::new_dim((NaMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                    SUB84(in_stack_ffffffffffffff88,0));
  local_2c = 0;
  while( true ) {
    uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x50));
    if (uVar1 <= local_2c) break;
    iVar2 = (*local_10->_vptr_NaDataStream[3])();
    local_20 = (char *)CONCAT44(extraout_var,iVar2);
    local_30 = 0;
    local_18 = local_20;
    while( true ) {
      uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x50));
      if (uVar1 <= local_30) break;
      dVar6 = strtod(local_20,&local_28);
      pNVar5 = NaMatrix::operator[]
                         ((NaMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      pNVar5[local_30] = dVar6;
      local_20 = local_28;
      local_30 = local_30 + 1;
    }
    local_2c = local_2c + 1;
  }
  NaMatrix::print_contents
            ((NaMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  NaMatrix::new_dim((NaMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                    SUB84(in_stack_ffffffffffffff88,0));
  local_2c = 0;
  while( true ) {
    uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x68));
    if (uVar1 <= local_2c) break;
    iVar2 = (*local_10->_vptr_NaDataStream[3])();
    local_20 = (char *)CONCAT44(extraout_var_00,iVar2);
    local_30 = 0;
    local_18 = local_20;
    while( true ) {
      uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x68));
      if (uVar1 <= local_30) break;
      dVar6 = strtod(local_20,&local_28);
      pNVar5 = NaMatrix::operator[]
                         ((NaMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      pNVar5[local_30] = dVar6;
      local_20 = local_28;
      local_30 = local_30 + 1;
    }
    local_2c = local_2c + 1;
  }
  NaMatrix::print_contents
            ((NaMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  NaMatrix::new_dim((NaMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                    SUB84(in_stack_ffffffffffffff88,0));
  local_2c = 0;
  while( true ) {
    uVar1 = local_2c;
    uVar3 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x80));
    if (uVar3 <= uVar1) break;
    iVar2 = (*local_10->_vptr_NaDataStream[3])();
    local_20 = (char *)CONCAT44(extraout_var_01,iVar2);
    local_30 = 0;
    local_18 = local_20;
    while( true ) {
      in_stack_ffffffffffffffa0 = local_30;
      uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x80));
      if (uVar1 <= in_stack_ffffffffffffffa0) break;
      in_stack_ffffffffffffff98 = strtod(local_20,&local_28);
      pNVar5 = NaMatrix::operator[]
                         ((NaMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      pNVar5[local_30] = in_stack_ffffffffffffff98;
      local_20 = local_28;
      local_30 = local_30 + 1;
    }
    local_2c = local_2c + 1;
  }
  NaMatrix::print_contents
            ((NaMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  NaMatrix::new_dim((NaMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                    SUB84(in_stack_ffffffffffffff88,0));
  local_2c = 0;
  while( true ) {
    uVar3 = local_2c;
    uVar4 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x98));
    n = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if (uVar4 <= uVar3) break;
    iVar2 = (*local_10->_vptr_NaDataStream[3])();
    local_20 = (char *)CONCAT44(extraout_var_02,iVar2);
    local_30 = 0;
    local_18 = local_20;
    while( true ) {
      in_stack_ffffffffffffff90 = local_30;
      uVar3 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x98));
      if (uVar3 <= in_stack_ffffffffffffff90) break;
      in_stack_ffffffffffffff88 = strtod(local_20,&local_28);
      pNVar5 = NaMatrix::operator[]
                         ((NaMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      pNVar5[local_30] = in_stack_ffffffffffffff88;
      local_20 = local_28;
      local_30 = local_30 + 1;
    }
    local_2c = local_2c + 1;
  }
  NaMatrix::print_contents
            ((NaMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  NaVector::new_dim((NaVector *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),n);
  NaVector::new_dim((NaVector *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),n);
  iVar2 = (*local_10->_vptr_NaDataStream[3])();
  local_20 = (char *)CONCAT44(extraout_var_03,iVar2);
  local_2c = 0;
  local_18 = local_20;
  while( true ) {
    uVar1 = local_2c;
    uVar4 = NaVector::dim((NaVector *)(in_RDI + 200));
    if (uVar4 <= uVar1) break;
    dVar6 = strtod(local_20,&local_28);
    pNVar5 = NaVector::operator[]
                       ((NaVector *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
                        (uint)((ulong)dVar6 >> 0x20));
    *pNVar5 = dVar6;
    local_20 = local_28;
    local_2c = local_2c + 1;
  }
  NaVector::print_contents((NaVector *)CONCAT44(uVar3,in_stack_ffffffffffffff90));
  NaUnit::Assign((NaUnit *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
                 (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),SUB84(in_stack_ffffffffffffff88,0)
                 ,uVar1);
  return;
}

Assistant:

void
NaStateSpaceModel::Load (NaDataStream& ds)
{
    char        *szBuf, *s, *p;
    unsigned     i, j;

    ds.GetF("%u %u %u", &n, &m, &k);
    NaPrintLog("N=%d  M=%d  K=%d\n", n, m, k);

    A.new_dim(n, n);
    for(i = 0; i < A.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < A.dim_cols(); ++j){
            A[i][j] = strtod(s, &p);
            s = p;
        }
    }
    A.print_contents();

    B.new_dim(n, k);
    for(i = 0; i < B.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < B.dim_cols(); ++j){
            B[i][j] = strtod(s, &p);
            s = p;
        }
    }
    B.print_contents();

    C.new_dim(m, n);
    for(i = 0; i < C.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < C.dim_cols(); ++j){
            C[i][j] = strtod(s, &p);
            s = p;
        }
    }
    C.print_contents();

    D.new_dim(m, k);
    for(i = 0; i < D.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < D.dim_cols(); ++j){
            D[i][j] = strtod(s, &p);
            s = p;
        }
    }
    D.print_contents();

    // Just to have right dimension
    x.new_dim(n);

    x0.new_dim(n);
    szBuf = ds.GetData();
    s = szBuf;
    for(i = 0; i < x0.dim(); ++i){
	x0[i] = strtod(s, &p);
	s = p;
    }
    x0.print_contents();

    Assign(k, m);
}